

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O3

void __thiscall CGameContext::Clear(CGameContext *this)

{
  int iVar1;
  CVoteOptionServer *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  CTuningParams *pCVar8;
  int *piVar9;
  long in_FS_OFFSET;
  byte bVar10;
  CTuningParams Tuning;
  int local_b0 [32];
  long local_30;
  
  bVar10 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = this->m_pVoteOptionLast;
  iVar1 = this->m_NumVoteOptions;
  pCVar8 = &this->m_Tuning;
  piVar9 = local_b0;
  for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
    *piVar9 = (pCVar8->m_GroundControlSpeed).m_Value;
    pCVar8 = (CTuningParams *)&pCVar8->m_GroundControlAccel;
    piVar9 = piVar9 + 1;
  }
  this->m_Resetting = true;
  uVar3 = *(undefined4 *)&this->m_pVoteOptionHeap;
  uVar4 = *(undefined4 *)((long)&this->m_pVoteOptionHeap + 4);
  uVar5 = *(undefined4 *)&this->m_pVoteOptionFirst;
  uVar6 = *(undefined4 *)((long)&this->m_pVoteOptionFirst + 4);
  (**(this->super_IGameServer).super_IInterface._vptr_IInterface)(this);
  mem_zero(this,0x36c8);
  CGameContext(this,0);
  *(undefined4 *)&this->m_pVoteOptionHeap = uVar3;
  *(undefined4 *)((long)&this->m_pVoteOptionHeap + 4) = uVar4;
  *(undefined4 *)&this->m_pVoteOptionFirst = uVar5;
  *(undefined4 *)((long)&this->m_pVoteOptionFirst + 4) = uVar6;
  this->m_pVoteOptionLast = pCVar2;
  this->m_NumVoteOptions = iVar1;
  piVar9 = local_b0;
  pCVar8 = &this->m_Tuning;
  for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pCVar8->m_GroundControlSpeed).m_Value = *piVar9;
    piVar9 = piVar9 + (ulong)bVar10 * -2 + 1;
    pCVar8 = (CTuningParams *)((long)pCVar8 + (ulong)bVar10 * -8 + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::Clear()
{
	CHeap *pVoteOptionHeap = m_pVoteOptionHeap;
	CVoteOptionServer *pVoteOptionFirst = m_pVoteOptionFirst;
	CVoteOptionServer *pVoteOptionLast = m_pVoteOptionLast;
	int NumVoteOptions = m_NumVoteOptions;
	CTuningParams Tuning = m_Tuning;

	m_Resetting = true;
	this->~CGameContext();
	mem_zero(this, sizeof(*this));
	new (this) CGameContext(RESET);

	m_pVoteOptionHeap = pVoteOptionHeap;
	m_pVoteOptionFirst = pVoteOptionFirst;
	m_pVoteOptionLast = pVoteOptionLast;
	m_NumVoteOptions = NumVoteOptions;
	m_Tuning = Tuning;
}